

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::UpdateHoveredWindowAndCaptureFlags(void)

{
  ImVector<ImGuiWindow_*> *this;
  ImVec2 *p;
  ushort uVar1;
  undefined1 auVar2 [12];
  ImVec2 IVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  ImGuiContext *pIVar6;
  ImGuiWindow **ppIVar7;
  ImGuiWindow *potential_parent;
  undefined1 uVar8;
  uint uVar9;
  byte bVar10;
  int iVar11;
  int iVar12;
  ulong uVar13;
  byte bVar14;
  ulong uVar15;
  bool bVar16;
  byte bVar17;
  byte bVar18;
  ImGuiWindow *pIVar19;
  ImGuiWindow *pIVar20;
  bool bVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  ImGuiWindow *local_88;
  ImRect local_78;
  ulong local_68;
  undefined8 uStack_60;
  ImVec2 local_58;
  undefined8 uStack_50;
  ImRect local_40;
  
  pIVar6 = GImGui;
  pIVar20 = GImGui->MovingWindow;
  pIVar19 = (ImGuiWindow *)0x0;
  if ((pIVar20 != (ImGuiWindow *)0x0) && ((pIVar20->Flags & 0x200) == 0)) {
    pIVar19 = pIVar20;
  }
  local_58 = (GImGui->Style).TouchExtraPadding;
  uStack_50 = 0;
  if ((GImGui->IO).ConfigWindowsResizeFromEdges == true) {
    auVar24._8_8_ = 0;
    auVar24._0_4_ = local_58.x;
    auVar24._4_4_ = local_58.y;
    auVar22._8_4_ = 0x40800000;
    auVar22._0_8_ = 0x4080000040800000;
    auVar22._12_4_ = 0x40800000;
    auVar24 = vmaxps_avx(auVar24,auVar22);
    local_68 = auVar24._0_8_;
  }
  else {
    local_68 = CONCAT44((int)((ulong)pIVar20 >> 0x20),local_58.x) |
               (ulong)local_58 & 0xffffffff00000000;
  }
  uStack_60 = 0;
  this = &GImGui->Windows;
  p = &(GImGui->IO).MousePos;
  local_88 = (ImGuiWindow *)0x0;
  iVar12 = (GImGui->Windows).Size;
LAB_00146c6d:
  do {
    iVar11 = iVar12;
    if (iVar11 < 1) {
      pIVar6->HoveredWindow = pIVar19;
      if (pIVar19 == (ImGuiWindow *)0x0) {
        pIVar19 = (ImGuiWindow *)0x0;
        pIVar20 = (ImGuiWindow *)0x0;
      }
      else {
LAB_00146dcc:
        pIVar20 = pIVar19->RootWindow;
      }
      pIVar6->HoveredRootWindow = pIVar20;
      pIVar6->HoveredWindowUnderMovingWindow = local_88;
      potential_parent = GetTopMostPopupModal();
      bVar21 = false;
      if ((potential_parent != (ImGuiWindow *)0x0) &&
         (bVar21 = false, pIVar20 != (ImGuiWindow *)0x0)) {
        bVar21 = IsWindowChildOf(pIVar20,potential_parent);
        bVar21 = !bVar21;
      }
      uVar9 = (pIVar6->IO).ConfigFlags;
      uVar13 = 0xffffffffffffffff;
      uVar15 = 0;
      bVar10 = 0;
      while( true ) {
        iVar12 = (int)uVar13;
        if (uVar15 == 5) break;
        if ((pIVar6->IO).MouseClicked[uVar15] == true) {
          bVar16 = true;
          if (pIVar19 == (ImGuiWindow *)0x0) {
            bVar16 = 0 < (pIVar6->OpenPopupStack).Size;
          }
          (pIVar6->IO).MouseDownOwned[uVar15] = bVar16;
        }
        bVar16 = (pIVar6->IO).MouseDown[uVar15];
        if ((bVar16 == true) &&
           ((iVar12 == -1 ||
            ((pIVar6->IO).MouseClickedTime[uVar15] < (pIVar6->IO).MouseClickedTime[iVar12])))) {
          uVar13 = uVar15 & 0xffffffff;
        }
        bVar10 = bVar10 & 1 | bVar16;
        uVar15 = uVar15 + 1;
      }
      bVar18 = 1;
      bVar14 = 1;
      if (iVar12 != -1) {
        bVar14 = (pIVar6->IO).MouseDownOwned[iVar12];
      }
      bVar17 = (byte)((uVar9 & 0x10) >> 4) | bVar21;
      if (pIVar6->DragDropActive == true) {
        bVar18 = (pIVar6->DragDropSourceFlags & 0x10U) == 0 | bVar17;
      }
      if (bVar14 != 0) {
        bVar18 = bVar17;
      }
      if (bVar18 != 0) {
        pIVar6->HoveredWindow = (ImGuiWindow *)0x0;
        pIVar6->HoveredRootWindow = (ImGuiWindow *)0x0;
        pIVar6->HoveredWindowUnderMovingWindow = (ImGuiWindow *)0x0;
        pIVar19 = (ImGuiWindow *)0x0;
      }
      if (pIVar6->WantCaptureMouseNextFrame == -1) {
        bVar21 = true;
        if ((bVar14 & (pIVar19 != (ImGuiWindow *)0x0 | bVar10)) == 0) {
          bVar21 = 0 < (pIVar6->OpenPopupStack).Size;
        }
        (pIVar6->IO).WantCaptureMouse = bVar21;
      }
      else {
        (pIVar6->IO).WantCaptureMouse = pIVar6->WantCaptureMouseNextFrame != 0;
      }
      if (pIVar6->WantCaptureKeyboardNextFrame == -1) {
        bVar21 = pIVar6->ActiveId != 0 || potential_parent != (ImGuiWindow *)0x0;
      }
      else {
        bVar21 = pIVar6->WantCaptureKeyboardNextFrame != 0;
      }
      uVar9 = uVar9 & 9;
      uVar8 = (char)uVar9;
      if (uVar9 != 1) {
        uVar8 = bVar21;
      }
      if ((pIVar6->IO).NavActive == false) {
        uVar8 = bVar21;
      }
      (pIVar6->IO).WantCaptureKeyboard = (bool)uVar8;
      (pIVar6->IO).WantTextInput = pIVar6->WantTextInputNextFrame - 1U < 0xfffffffe;
      return;
    }
    iVar12 = iVar11 + -1;
    ppIVar7 = ImVector<ImGuiWindow_*>::operator[](this,iVar12);
    pIVar20 = *ppIVar7;
  } while (((pIVar20->Active != true) || (pIVar20->Hidden != false)) ||
          ((pIVar20->Flags & 0x200) != 0));
  IVar3 = (pIVar20->OuterRectClipped).Max;
  bVar21 = (pIVar20->Flags & 0x1000042U) == 0;
  auVar23[1] = bVar21;
  auVar23[0] = bVar21;
  auVar23[2] = bVar21;
  auVar23[3] = bVar21;
  auVar23[4] = bVar21;
  auVar23[5] = bVar21;
  auVar23[6] = bVar21;
  auVar23[7] = bVar21;
  auVar23[8] = bVar21;
  auVar23[9] = bVar21;
  auVar23[10] = bVar21;
  auVar23[0xb] = bVar21;
  auVar23[0xc] = bVar21;
  auVar23[0xd] = bVar21;
  auVar23[0xe] = bVar21;
  auVar23[0xf] = bVar21;
  auVar24 = vpslld_avx(auVar23,0x1f);
  auVar5._8_8_ = uStack_50;
  auVar5._0_4_ = local_58.x;
  auVar5._4_4_ = local_58.y;
  auVar4._8_8_ = uStack_60;
  auVar4._0_8_ = local_68;
  auVar24 = vblendvps_avx(auVar5,auVar4,auVar24);
  auVar22 = vsubps_avx((undefined1  [16])pIVar20->OuterRectClipped,auVar24);
  auVar2._4_8_ = auVar24._0_8_;
  auVar2._0_4_ = (pIVar20->OuterRectClipped).Min.y + auVar24._4_4_;
  auVar26._0_8_ = auVar2._0_8_ << 0x20;
  auVar26._8_4_ = IVar3.x + auVar24._0_4_;
  auVar26._12_4_ = IVar3.y + auVar24._4_4_;
  local_78.Min = auVar22._0_8_;
  local_78.Max = auVar26._8_8_;
  bVar21 = ImRect::Contains(&local_78,p);
  if (bVar21) {
    uVar1 = (pIVar20->HitTestHoleSize).x;
    if (uVar1 != 0) {
      auVar22 = vpinsrw_avx(ZEXT216(uVar1),(uint)(ushort)(pIVar20->HitTestHoleSize).y,1);
      auVar24 = vpmovsxwd_avx(ZEXT416((uint)pIVar20->HitTestHoleOffset));
      auVar24 = vcvtdq2ps_avx(auVar24);
      auVar27._0_4_ = (pIVar20->Pos).x + auVar24._0_4_;
      auVar27._4_4_ = (pIVar20->Pos).y + auVar24._4_4_;
      auVar27._8_4_ = auVar24._8_4_ + 0.0;
      auVar27._12_4_ = auVar24._12_4_ + 0.0;
      auVar24 = vpmovsxwd_avx(auVar22);
      auVar24 = vcvtdq2ps_avx(auVar24);
      auVar25._0_4_ = auVar27._0_4_ + auVar24._0_4_;
      auVar25._4_4_ = auVar27._4_4_ + auVar24._4_4_;
      auVar25._8_4_ = auVar27._8_4_ + auVar24._8_4_;
      auVar25._12_4_ = auVar27._12_4_ + auVar24._12_4_;
      local_40 = (ImRect)vmovlhps_avx(auVar27,auVar25);
      bVar21 = ImRect::Contains(&local_40,p);
      if (bVar21) goto LAB_00146c6d;
    }
    if (pIVar19 == (ImGuiWindow *)0x0) {
      pIVar19 = pIVar20;
    }
    if (((local_88 == (ImGuiWindow *)0x0) &&
        (local_88 = pIVar20, pIVar6->MovingWindow != (ImGuiWindow *)0x0)) &&
       (pIVar20->RootWindow == pIVar6->MovingWindow->RootWindow)) {
      local_88 = (ImGuiWindow *)0x0;
    }
    else {
      if (pIVar19 != (ImGuiWindow *)0x0) {
        pIVar6->HoveredWindow = pIVar19;
        goto LAB_00146dcc;
      }
      pIVar19 = (ImGuiWindow *)0x0;
    }
  }
  iVar12 = iVar11 + -1;
  goto LAB_00146c6d;
}

Assistant:

void ImGui::UpdateHoveredWindowAndCaptureFlags()
{
    ImGuiContext& g = *GImGui;

    // Find the window hovered by mouse:
    // - Child windows can extend beyond the limit of their parent so we need to derive HoveredRootWindow from HoveredWindow.
    // - When moving a window we can skip the search, which also conveniently bypasses the fact that window->WindowRectClipped is lagging as this point of the frame.
    // - We also support the moved window toggling the NoInputs flag after moving has started in order to be able to detect windows below it, which is useful for e.g. docking mechanisms.
    bool clear_hovered_windows = false;
    FindHoveredWindow();

    // Modal windows prevents mouse from hovering behind them.
    ImGuiWindow* modal_window = GetTopMostPopupModal();
    if (modal_window && g.HoveredRootWindow && !IsWindowChildOf(g.HoveredRootWindow, modal_window))
        clear_hovered_windows = true;

    // Disabled mouse?
    if (g.IO.ConfigFlags & ImGuiConfigFlags_NoMouse)
        clear_hovered_windows = true;

    // We track click ownership. When clicked outside of a window the click is owned by the application and won't report hovering nor request capture even while dragging over our windows afterward.
    int mouse_earliest_button_down = -1;
    bool mouse_any_down = false;
    for (int i = 0; i < IM_ARRAYSIZE(g.IO.MouseDown); i++)
    {
        if (g.IO.MouseClicked[i])
            g.IO.MouseDownOwned[i] = (g.HoveredWindow != NULL) || (g.OpenPopupStack.Size > 0);
        mouse_any_down |= g.IO.MouseDown[i];
        if (g.IO.MouseDown[i])
            if (mouse_earliest_button_down == -1 || g.IO.MouseClickedTime[i] < g.IO.MouseClickedTime[mouse_earliest_button_down])
                mouse_earliest_button_down = i;
    }
    const bool mouse_avail_to_imgui = (mouse_earliest_button_down == -1) || g.IO.MouseDownOwned[mouse_earliest_button_down];

    // If mouse was first clicked outside of ImGui bounds we also cancel out hovering.
    // FIXME: For patterns of drag and drop across OS windows, we may need to rework/remove this test (first committed 311c0ca9 on 2015/02)
    const bool mouse_dragging_extern_payload = g.DragDropActive && (g.DragDropSourceFlags & ImGuiDragDropFlags_SourceExtern) != 0;
    if (!mouse_avail_to_imgui && !mouse_dragging_extern_payload)
        clear_hovered_windows = true;

    if (clear_hovered_windows)
        g.HoveredWindow = g.HoveredRootWindow = g.HoveredWindowUnderMovingWindow = NULL;

    // Update io.WantCaptureMouse for the user application (true = dispatch mouse info to imgui, false = dispatch mouse info to Dear ImGui + app)
    if (g.WantCaptureMouseNextFrame != -1)
        g.IO.WantCaptureMouse = (g.WantCaptureMouseNextFrame != 0);
    else
        g.IO.WantCaptureMouse = (mouse_avail_to_imgui && (g.HoveredWindow != NULL || mouse_any_down)) || (g.OpenPopupStack.Size > 0);

    // Update io.WantCaptureKeyboard for the user application (true = dispatch keyboard info to imgui, false = dispatch keyboard info to Dear ImGui + app)
    if (g.WantCaptureKeyboardNextFrame != -1)
        g.IO.WantCaptureKeyboard = (g.WantCaptureKeyboardNextFrame != 0);
    else
        g.IO.WantCaptureKeyboard = (g.ActiveId != 0) || (modal_window != NULL);
    if (g.IO.NavActive && (g.IO.ConfigFlags & ImGuiConfigFlags_NavEnableKeyboard) && !(g.IO.ConfigFlags & ImGuiConfigFlags_NavNoCaptureKeyboard))
        g.IO.WantCaptureKeyboard = true;

    // Update io.WantTextInput flag, this is to allow systems without a keyboard (e.g. mobile, hand-held) to show a software keyboard if possible
    g.IO.WantTextInput = (g.WantTextInputNextFrame != -1) ? (g.WantTextInputNextFrame != 0) : false;
}